

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O2

void vtt_dump(vtt_t *head)

{
  double dVar1;
  vtt_block_t *pvVar2;
  double dVar3;
  
  puts("WEBVTT\r\n\r");
  pvVar2 = (vtt_block_t *)head;
  while (pvVar2 = pvVar2->next, pvVar2 != (vtt_block_t *)0x0) {
    printf("REGION\r\n%s\r\n",pvVar2 + 1);
  }
  pvVar2 = (vtt_block_t *)&head->style_head;
  while (pvVar2 = pvVar2->next, pvVar2 != (vtt_block_t *)0x0) {
    printf("STYLE\r\n%s\r\n",pvVar2 + 1);
  }
  pvVar2 = (vtt_block_t *)&head->cue_head;
  while (pvVar2 = pvVar2->next, pvVar2 != (vtt_block_t *)0x0) {
    dVar1 = pvVar2->timestamp;
    dVar3 = pvVar2->duration + dVar1;
    if (pvVar2->cue_id != (char *)0x0) {
      puts(pvVar2->cue_id);
    }
    printf("%02d:%02d:%02d.%03d --> %02d:%02d:%02d.%03d",(long)(dVar1 / 3600.0),
           (long)(dVar1 / 60.0) % 0x3c & 0xffffffff,(long)dVar1 % 0x3c & 0xffffffff,
           (long)(dVar1 * 1000.0) % 1000 & 0xffffffff,(long)(dVar3 / 3600.0),
           (long)(dVar3 / 60.0) % 0x3c,(long)dVar3 % 0x3c,(long)(dVar3 * 1000.0) % 1000);
    if (pvVar2->cue_settings != (char *)0x0) {
      printf(" %s");
    }
    printf("\r\n%s\r\n",pvVar2 + 1);
  }
  return;
}

Assistant:

void vtt_dump(vtt_t* head) { _dump(head); }